

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditDelibsTests.cpp
# Opt level: O2

int __thiscall dit::DepoolTests::init(DepoolTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  SelfCheckCase *pSVar1;
  
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"array",
             "dePoolArray_selfTest()",dePoolArray_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"heap",
             "dePoolHeap_selfTest()",dePoolHeap_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"hash",
             "dePoolHash_selfTest()",dePoolHash_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"set",
             "dePoolSet_selfTest()",dePoolSet_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"hash_set",
             "dePoolHashSet_selfTest()",dePoolHashSet_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"hash_array",
             "dePoolHashArray_selfTest()",dePoolHashArray_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"multi_set",
             "dePoolMultiSet_selfTest()",dePoolMultiSet_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new SelfCheckCase(m_testCtx, "array",		"dePoolArray_selfTest()",		dePoolArray_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "heap",		"dePoolHeap_selfTest()",		dePoolHeap_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "hash",		"dePoolHash_selfTest()",		dePoolHash_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "set",		"dePoolSet_selfTest()",			dePoolSet_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "hash_set",	"dePoolHashSet_selfTest()",		dePoolHashSet_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "hash_array",	"dePoolHashArray_selfTest()",	dePoolHashArray_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "multi_set",	"dePoolMultiSet_selfTest()",	dePoolMultiSet_selfTest));
	}